

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O2

void __thiscall Scene::~Scene(Scene *this)

{
  int i_1;
  long lVar1;
  int i;
  long lVar2;
  
  lVar1 = 0;
  for (lVar2 = 0; lVar2 < this->m_materials_size; lVar2 = lVar2 + 1) {
    safe_delete<Material>((Material **)((long)this->m_materials + lVar1));
    lVar1 = lVar1 + 8;
  }
  safe_array_delete<Material*>(&this->m_materials);
  lVar2 = 0;
  for (lVar1 = 0; lVar1 < this->m_textures_size; lVar1 = lVar1 + 1) {
    safe_delete<Texture>((Texture **)((long)this->m_textures + lVar2));
    lVar2 = lVar2 + 8;
  }
  safe_array_delete<Texture*>(&this->m_textures);
  lVar2 = 0;
  for (lVar1 = 0; lVar1 < this->m_objects_size; lVar1 = lVar1 + 1) {
    safe_delete<Object>((Object **)((long)this->m_objects + lVar2));
    lVar2 = lVar2 + 8;
  }
  safe_array_delete<Object*>(&this->m_objects);
  return;
}

Assistant:

Scene::~Scene()
{
    for(int i=0; i<m_materials_size; ++i) {
        safe_delete(m_materials[i]);
    }
    safe_array_delete(m_materials);

    for(int i=0; i<m_textures_size; ++i) {
        safe_delete(m_textures[i]);
    }
    safe_array_delete(m_textures);

    for(int i=0; i<m_objects_size; ++i) {
        safe_delete(m_objects[i]);
    }
    safe_array_delete(m_objects);
}